

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_voter.hpp
# Opt level: O0

external_ip * __thiscall
libtorrent::aux::external_ip::operator=(external_ip *this,external_ip *param_1)

{
  long local_28;
  unsigned_long __i1;
  unsigned_long __i0;
  external_ip *param_1_local;
  external_ip *this_local;
  
  for (__i1 = 0; __i1 != 2; __i1 = __i1 + 1) {
    for (local_28 = 0; local_28 != 2; local_28 = local_28 + 1) {
      boost::asio::ip::address::operator=
                (this->m_addresses[__i1] + local_28,param_1->m_addresses[__i1] + local_28);
    }
  }
  return this;
}

Assistant:

struct TORRENT_EXTRA_EXPORT external_ip
	{
		external_ip()
			: m_addresses{{address_v4(), address_v6()}, {address_v4(), address_v6()}}
		{}

		external_ip(address const& local4, address const& global4
			, address const& local6, address const& global6);

		// the external IP as it would be observed from `ip`
		address external_address(address const& ip) const;

	private:

		// support one local and one global address per address family
		// [0][n] = global [1][n] = local
		// [n][0] = IPv4 [n][1] = IPv6
		// TODO: 1 have one instance per possible subnet, 192.168.x.x, 10.x.x.x, etc.
		address m_addresses[2][2];
	}